

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<512,Blob<160>>
               (hashfunc<Blob<160>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> hashes;
  Blob<160> h;
  vector<Blob<160>,_std::allocator<Blob<160>_>_> local_b8;
  value_type local_98;
  Blob<512> local_78;
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x200,pcVar2,(ulong)(uint)setbits)
  ;
  local_b8.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.bytes[0] = '\0';
  local_78.bytes[1] = '\0';
  local_78.bytes[2] = '\0';
  local_78.bytes[3] = '\0';
  local_78.bytes[4] = '\0';
  local_78.bytes[5] = '\0';
  local_78.bytes[6] = '\0';
  local_78.bytes[7] = '\0';
  local_78.bytes[8] = '\0';
  local_78.bytes[9] = '\0';
  local_78.bytes[10] = '\0';
  local_78.bytes[0xb] = '\0';
  local_78.bytes[0xc] = '\0';
  local_78.bytes[0xd] = '\0';
  local_78.bytes[0xe] = '\0';
  local_78.bytes[0xf] = '\0';
  local_78.bytes[0x10] = '\0';
  local_78.bytes[0x11] = '\0';
  local_78.bytes[0x12] = '\0';
  local_78.bytes[0x13] = '\0';
  local_78.bytes[0x14] = '\0';
  local_78.bytes[0x15] = '\0';
  local_78.bytes[0x16] = '\0';
  local_78.bytes[0x17] = '\0';
  local_78.bytes[0x18] = '\0';
  local_78.bytes[0x19] = '\0';
  local_78.bytes[0x1a] = '\0';
  local_78.bytes[0x1b] = '\0';
  local_78.bytes[0x1c] = '\0';
  local_78.bytes[0x1d] = '\0';
  local_78.bytes[0x1e] = '\0';
  local_78.bytes[0x1f] = '\0';
  local_78.bytes[0x20] = '\0';
  local_78.bytes[0x21] = '\0';
  local_78.bytes[0x22] = '\0';
  local_78.bytes[0x23] = '\0';
  local_78.bytes[0x24] = '\0';
  local_78.bytes[0x25] = '\0';
  local_78.bytes[0x26] = '\0';
  local_78.bytes[0x27] = '\0';
  local_78.bytes[0x28] = '\0';
  local_78.bytes[0x29] = '\0';
  local_78.bytes[0x2a] = '\0';
  local_78.bytes[0x2b] = '\0';
  local_78.bytes[0x2c] = '\0';
  local_78.bytes[0x2d] = '\0';
  local_78.bytes[0x2e] = '\0';
  local_78.bytes[0x2f] = '\0';
  local_78.bytes[0x30] = '\0';
  local_78.bytes[0x31] = '\0';
  local_78.bytes[0x32] = '\0';
  local_78.bytes[0x33] = '\0';
  local_78.bytes[0x34] = '\0';
  local_78.bytes[0x35] = '\0';
  local_78.bytes[0x36] = '\0';
  local_78.bytes[0x37] = '\0';
  local_78.bytes[0x38] = '\0';
  local_78.bytes[0x39] = '\0';
  local_78.bytes[0x3a] = '\0';
  local_78.bytes[0x3b] = '\0';
  local_78.bytes[0x3c] = '\0';
  local_78.bytes[0x3d] = '\0';
  local_78.bytes[0x3e] = '\0';
  local_78.bytes[0x3f] = '\0';
  if (iVar3 != 0) {
    local_98.bytes[0] = '\0';
    local_98.bytes[1] = '\0';
    local_98.bytes[2] = '\0';
    local_98.bytes[3] = '\0';
    local_98.bytes[4] = '\0';
    local_98.bytes[5] = '\0';
    local_98.bytes[6] = '\0';
    local_98.bytes[7] = '\0';
    local_98.bytes[8] = '\0';
    local_98.bytes[9] = '\0';
    local_98.bytes[10] = '\0';
    local_98.bytes[0xb] = '\0';
    local_98.bytes[0xc] = '\0';
    local_98.bytes[0xd] = '\0';
    local_98.bytes[0xe] = '\0';
    local_98.bytes[0xf] = '\0';
    local_98.bytes[0x10] = '\0';
    local_98.bytes[0x11] = '\0';
    local_98.bytes[0x12] = '\0';
    local_98.bytes[0x13] = '\0';
    (*hash.m_hash)(&local_78,0x40,0,&local_98);
    std::vector<Blob<160>,_std::allocator<Blob<160>_>_>::push_back(&local_b8,&local_98);
  }
  SparseKeygenRecurse<Blob<512>,Blob<160>>(hash.m_hash,0,setbits,inclusive,&local_78,&local_b8);
  printf("%d keys\n",
         (ulong)(uint)((int)((ulong)((long)local_b8.
                                           super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_b8.
                                          super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x33333333));
  bVar1 = TestHashList<Blob<160>>(&local_b8,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_b8.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<Blob<160>,_std::allocator<Blob<160>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}